

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2612intf.c
# Opt level: O2

UINT8 device_start_ym2612_gens(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  ym2612_ *pyVar1;
  uint Rate;
  
  Rate = cfg->clock / 0x90;
  if (cfg->srMode == '\x02') {
    if (Rate <= cfg->smplRate) {
      Rate = cfg->smplRate;
    }
  }
  else if (cfg->srMode == '\x01') {
    Rate = cfg->smplRate;
  }
  pyVar1 = YM2612_Init(cfg->clock,Rate,'\0');
  pyVar1->_devData = (DEV_DATA)pyVar1;
  retDevInf->dataPtr = &pyVar1->_devData;
  retDevInf->sampleRate = Rate;
  retDevInf->devDef = &devDef_Gens;
  retDevInf->linkDevCount = 0;
  retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  return '\0';
}

Assistant:

static UINT8 device_start_ym2612_gens(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	ym2612_* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 2 / 72;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = YM2612_Init(cfg->clock, rate, 0);
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef_Gens);
	return 0x00;
}